

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOCBparser.c
# Opt level: O2

docbDocPtr docbParseDoc(xmlChar *cur,char *encoding)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlDocPtr pxVar4;
  
  if (docbParseDoc_deprecated == '\0') {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"docbParseChunk() deprecated function reached\n");
    docbParseDoc_deprecated = '\x01';
  }
  pxVar4 = xmlParseDoc(cur);
  return pxVar4;
}

Assistant:

docbDocPtr
docbParseDoc(xmlChar * cur ATTRIBUTE_UNUSED,
             const char *encoding ATTRIBUTE_UNUSED)
{
    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "docbParseChunk() deprecated function reached\n");
        deprecated = 1;
    }

    return (xmlParseDoc(cur));
}